

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::EnumDef::Deserialize(EnumDef *this,Parser *parser,Enum *_enum)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  EnumVal *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Enum *pEVar7;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  uint uVar8;
  ushort uVar9;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  ulong uVar10;
  ulong uVar11;
  unsigned_short vtsize;
  string local_70;
  string local_50;
  
  uVar4 = (ulong)*(ushort *)(_enum + (4 - (long)*(int *)_enum));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,_enum + (ulong)*(uint *)(_enum + uVar4) + 4 + uVar4,
             _enum + (ulong)*(uint *)(_enum + (ulong)*(uint *)(_enum + uVar4) + 4 + uVar4 + -4) +
                     *(uint *)(_enum + uVar4) + uVar4 + 4);
  Parser::UnqualifiedName(&local_50,parser,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  lVar5 = (long)*(int *)_enum;
  uVar9 = *(ushort *)(_enum + -lVar5);
  uVar10 = (ulong)*(ushort *)(_enum + -lVar5 + 6);
  uVar4 = (ulong)*(uint *)(_enum + uVar10);
  if (*(int *)(_enum + uVar4 + uVar10) != 0) {
    uVar8 = 0;
    uVar11 = 0;
    do {
      this_00 = (EnumVal *)operator_new(0xa8);
      paVar6 = &(this_00->name).field_2;
      p_Var1 = &(this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header;
      pEVar7 = _enum + uVar4 + uVar10;
      (this_00->name)._M_dataplus._M_p = (pointer)paVar6;
      (this_00->name)._M_string_length = 0;
      (this_00->name).field_2._M_local_buf[0] = '\0';
      (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this_00->doc_comment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->doc_comment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->doc_comment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->union_type).base_type = BASE_TYPE_NONE;
      (this_00->union_type).element = BASE_TYPE_NONE;
      (this_00->union_type).struct_def = (StructDef *)0x0;
      (this_00->union_type).enum_def = (EnumDef *)0x0;
      (this_00->union_type).fixed_length = 0;
      (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (this_00->attributes).vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->attributes).vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->attributes).vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00->value = 0;
      if (uVar9 < 7) {
        pEVar7 = (Enum *)0x0;
      }
      if (*(uint *)pEVar7 <= uVar11) {
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,
                      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::EnumVal>, SizeT = unsigned int]"
                     );
      }
      bVar3 = EnumVal::Deserialize
                        (this_00,parser,
                         (EnumVal *)
                         (pEVar7 + (ulong)*(uint *)(pEVar7 + (ulong)uVar8 + 4) + (ulong)uVar8 + 4));
      if ((!bVar3) ||
         (bVar3 = SymbolTable<flatbuffers::EnumVal>::Add(&this->vals,(string *)this_00,this_00),
         bVar3)) {
        SymbolTable<flatbuffers::Value>::~SymbolTable(&this_00->attributes);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&this_00->doc_comment);
        pcVar2 = (this_00->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar6) {
          operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
        }
        operator_delete(this_00,0xa8);
        return false;
      }
      uVar11 = uVar11 + 1;
      lVar5 = (long)*(int *)_enum;
      uVar9 = *(ushort *)(_enum + -lVar5);
      uVar10 = (ulong)*(ushort *)(_enum + -lVar5 + 6);
      uVar4 = (ulong)*(uint *)(_enum + uVar10);
      uVar8 = uVar8 + 4;
    } while (uVar11 < *(uint *)(_enum + uVar4 + uVar10));
  }
  if (uVar9 < 9) {
    this->is_union = false;
  }
  else {
    if ((ulong)*(ushort *)(_enum + -lVar5 + 8) == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = _enum[*(ushort *)(_enum + -lVar5 + 8)].super_Table != (Table)0x0;
    }
    this->is_union = bVar3;
    if ((10 < uVar9) && (uVar4 = (ulong)*(ushort *)(_enum + -lVar5 + 10), uVar4 != 0)) {
      type = (Type *)(_enum + *(uint *)(_enum + uVar4) + uVar4);
      goto LAB_00120f02;
    }
  }
  type = (Type *)0x0;
LAB_00120f02:
  bVar3 = Type::Deserialize(&this->underlying_type,parser,type);
  if (bVar3) {
    if ((*(ushort *)(_enum + -(long)*(int *)_enum) < 0xd) ||
       (uVar4 = (ulong)*(ushort *)(_enum + (0xc - (long)*(int *)_enum)), uVar4 == 0)) {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
    }
    else {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
              (_enum + *(uint *)(_enum + uVar4) + uVar4);
    }
    bVar3 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
    if (bVar3) {
      if ((*(ushort *)(_enum + -(long)*(int *)_enum) < 0xf) ||
         (uVar4 = (ulong)*(ushort *)(_enum + (0xe - (long)*(int *)_enum)), uVar4 == 0)) {
        documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
      }
      else {
        documentation =
             (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
             (_enum + *(uint *)(_enum + uVar4) + uVar4);
      }
      anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
      return true;
    }
  }
  return false;
}

Assistant:

bool EnumDef::Deserialize(Parser &parser, const reflection::Enum *_enum) {
  name = parser.UnqualifiedName(_enum->name()->str());
  for (uoffset_t i = 0; i < _enum->values()->size(); ++i) {
    auto val = new EnumVal();
    if (!val->Deserialize(parser, _enum->values()->Get(i)) ||
        vals.Add(val->name, val)) {
      delete val;
      return false;
    }
  }
  is_union = _enum->is_union();
  if (!underlying_type.Deserialize(parser, _enum->underlying_type())) {
    return false;
  }
  if (!DeserializeAttributes(parser, _enum->attributes())) return false;
  DeserializeDoc(doc_comment, _enum->documentation());
  return true;
}